

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkPreparing(XmlReporter *this,string *name)

{
  XmlFormatting fmt;
  XmlWriter *this_00;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *name_local;
  XmlReporter *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"BenchmarkResults",&local_39);
  fmt = operator|(Newline,Indent);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_38,fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"name",&local_71);
  XmlWriter::writeAttribute(this_00,&local_70,local_18);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void XmlReporter::benchmarkPreparing(std::string const &name) {
        m_xml.startElement("BenchmarkResults")
            .writeAttribute("name", name);
    }